

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

void missum(monst *mdef,attack *mattk)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  obj *poVar4;
  attack *mattk_local;
  monst *mdef_local;
  
  iVar2 = could_seduce(&youmonst,mdef,mattk);
  if (iVar2 != 0) {
    pcVar3 = mon_nam(mdef);
    pline("You pretend to be friendly to %s.",pcVar3);
    goto LAB_003257f0;
  }
  if (mdef->wormno == '\0') {
    if (((viz_array[mdef->my][mdef->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((mdef->data->mflags3 & 0x200) != 0 && ((viz_array[mdef->my][mdef->mx] & 1U) != 0))))))))
    goto LAB_00325564;
LAB_003255f1:
    if (((((mdef->data->mflags1 & 0x10000) == 0) &&
         ((poVar4 = which_armor(mdef,4), poVar4 == (obj *)0x0 ||
          (poVar4 = which_armor(mdef,4), poVar4->otyp != 0x4f)))) &&
        (((((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
            ((((u.uprops[0x19].intrinsic != 0 ||
               ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
              (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
          (u.uprops[0x19].blocked == 0)) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar2 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar2 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar1 = match_warn_of_mon(mdef), bVar1 != '\0')))) goto LAB_003257b4;
  }
  else {
    bVar1 = worm_known(level,mdef);
    if (bVar1 == '\0') goto LAB_003255f1;
LAB_00325564:
    if (((((((*(uint *)&mdef->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&mdef->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mdef->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_003255f1;
LAB_003257b4:
    if (flags.verbose != '\0') {
      pcVar3 = mon_nam(mdef);
      pline("You miss %s.",pcVar3);
      goto LAB_003257f0;
    }
  }
  pline("You miss it.");
LAB_003257f0:
  if (((*(uint *)&mdef->field_0x60 >> 0x13 & 1) == 0) &&
     ((*(uint *)&mdef->field_0x60 >> 0x12 & 1) != 0)) {
    wakeup(mdef);
  }
  return;
}

Assistant:

void missum(struct monst *mdef, const struct attack *mattk)
{
	if (could_seduce(&youmonst, mdef, mattk))
		pline("You pretend to be friendly to %s.", mon_nam(mdef));
	else if (canspotmon(level, mdef) && flags.verbose)
		pline("You miss %s.", mon_nam(mdef));
	else
		pline("You miss it.");
	if (!mdef->msleeping && mdef->mcanmove)
		wakeup(mdef);
}